

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

void __thiscall CVmHashTable::~CVmHashTable(CVmHashTable *this)

{
  undefined8 *in_RDI;
  CVmHashTable *unaff_retaddr;
  
  if (((*(byte *)(in_RDI + 3) & 1) != 0) && ((long *)in_RDI[2] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[2] + 8))();
  }
  delete_all_entries(unaff_retaddr);
  if (((*(byte *)(in_RDI + 3) >> 1 & 1) != 0) && ((void *)*in_RDI != (void *)0x0)) {
    operator_delete__((void *)*in_RDI);
  }
  return;
}

Assistant:

CVmHashTable::~CVmHashTable()
{
    /* delete the hash function object if I own it */
    if (own_hash_func_)
        delete hash_function_;

    /* delete each entry in the hash table */
    delete_all_entries();

    /* delete the hash table */
    if (own_hash_table_)
        delete [] table_;
}